

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.h
# Opt level: O2

void __thiscall
absl::lts_20250127::str_format_internal::FormatSinkImpl::Append
          (FormatSinkImpl *this,size_t n,char c)

{
  FormatSinkImpl *__s;
  ulong __n;
  
  if (n != 0) {
    this->size_ = this->size_ + n;
    while( true ) {
      __s = (FormatSinkImpl *)this->pos_;
      __n = (long)(this + 1) - (long)__s;
      if (n < __n || n - __n == 0) break;
      if (this + 1 != __s) {
        memset(__s,(uint)(byte)c,__n);
        this->pos_ = this->pos_ + __n;
      }
      Flush(this);
      n = n - __n;
    }
    memset(__s,(uint)(byte)c,n);
    this->pos_ = this->pos_ + n;
  }
  return;
}

Assistant:

void Append(size_t n, char c) {
    if (n == 0) return;
    size_ += n;
    auto raw_append = [&](size_t count) {
      memset(pos_, c, count);
      pos_ += count;
    };
    while (n > Avail()) {
      n -= Avail();
      if (Avail() > 0) {
        raw_append(Avail());
      }
      Flush();
    }
    raw_append(n);
  }